

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_fconst_0(ExecutionEngine *this)

{
  Value operand;
  VMStack *this_00;
  Frame *this_01;
  undefined4 local_30;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand.type = 5;
  operand.printType = local_30;
  operand.data.longValue = (ulong)value.type << 0x20;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_fconst_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;
    value.type = ValueType::FLOAT;
    value.data.floatValue = 0;

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}